

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O3

int __thiscall
jsoncons::jsonpath::detail::
wildcard_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::select(wildcard_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
         *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
        timeval *__timeout)

{
  supertype *psVar1;
  bool bVar2;
  fd_set *pfVar3;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *pkVar4;
  path_node_type *ppVar5;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar6;
  undefined7 extraout_var;
  uint uVar7;
  value_type *pvVar8;
  undefined4 in_register_00000034;
  eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
  *this_00;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *i;
  uint in_stack_00000008;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *local_60;
  basic_path_node<char> *local_58;
  const_object_range_type local_50;
  
  this_00 = (eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
             *)CONCAT44(in_register_00000034,__nfds);
  pfVar3 = __exceptfds;
  while (uVar7 = (byte)pfVar3->fds_bits[0] & 0xf, uVar7 - 8 < 2) {
    pfVar3 = (fd_set *)pfVar3->fds_bits[1];
  }
  if (uVar7 == 0xe) {
    pkVar4 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *)basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                          ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                           __exceptfds);
    if (pkVar4 != (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   *)0x0) {
      i = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           *)0x0;
      do {
        ppVar5 = (path_node_type *)__writefds;
        local_50.first_.it_._M_current = i;
        if ((in_stack_00000008 & 0xb) != 0) {
          local_70._M_len = (size_t)__writefds;
          ppVar5 = eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
                   ::
                   create_path_node<jsoncons::jsonpath::basic_path_node<char>const*,unsigned_long&>
                             (this_00,(basic_path_node<char> **)&local_70,(unsigned_long *)&local_50
                             );
        }
        pbVar6 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                           ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                            __exceptfds,(size_t)i);
        psVar1 = (this->
                 super_base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 ).tail_;
        if (psVar1 == (supertype *)0x0) {
          (**(code **)(__timeout->tv_sec + 0x10))(__timeout,ppVar5,pbVar6);
        }
        else {
          (*psVar1->_vptr_jsonpath_selector[2])
                    (psVar1,this_00,__readfds,ppVar5,pbVar6,__timeout,in_stack_00000008);
        }
        i = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
             *)((long)&(i->key_)._M_dataplus._M_p + 1);
        pkVar4 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                               __exceptfds);
      } while (i < pkVar4);
    }
  }
  else {
    bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                       __exceptfds);
    pkVar4 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *)CONCAT71(extraout_var,bVar2);
    if (bVar2) {
      basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_range_abi_cxx11_
                (&local_50,
                 (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)__exceptfds);
      local_60 = local_50.last_.it_._M_current;
      bVar2 = local_50.first_.has_value_ == local_50.last_.has_value_;
      if ((local_50.first_.has_value_ & local_50.last_.has_value_ & 1U) != 0) {
        bVar2 = local_50.first_.it_._M_current == local_50.last_.it_._M_current;
      }
      pkVar4 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *)(ulong)bVar2;
      if (bVar2 == false) {
        pvVar8 = &(local_50.first_.it_._M_current)->value_;
        do {
          local_70._M_str =
               (((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)(pvVar8 + -2))->key_)._M_dataplus._M_p;
          local_70._M_len =
               (((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)(pvVar8 + -2))->key_)._M_string_length;
          ppVar5 = (path_node_type *)__writefds;
          if ((in_stack_00000008 & 0xb) != 0) {
            local_58 = (basic_path_node<char> *)__writefds;
            ppVar5 = eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
                     ::
                     create_path_node<jsoncons::jsonpath::basic_path_node<char>const*,std::basic_string_view<char,std::char_traits<char>>const&>
                               (this_00,&local_58,&local_70);
          }
          psVar1 = (this->
                   super_base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                   ).tail_;
          if (psVar1 == (supertype *)0x0) {
            (**(code **)(__timeout->tv_sec + 0x10))(__timeout,ppVar5,pvVar8);
          }
          else {
            (*psVar1->_vptr_jsonpath_selector[2])
                      (psVar1,this_00,__readfds,ppVar5,pvVar8,__timeout,in_stack_00000008);
          }
          pkVar4 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    *)(pvVar8 + 1);
          bVar2 = pkVar4 == local_60;
          if ((local_50.first_.has_value_ & local_50.last_.has_value_ & 1U) == 0) {
            bVar2 = local_50.first_.has_value_ == local_50.last_.has_value_;
          }
          pvVar8 = pvVar8 + 3;
        } while (!bVar2);
      }
    }
  }
  return (int)pkVar4;
}

Assistant:

void select(eval_context<Json,JsonReference>& context,
                    reference root,
                    const path_node_type& last, 
                    reference current,
                    node_receiver_type& receiver,
                    result_options options) const override
        {
            if (current.is_array())
            {
                for (std::size_t i = 0; i < current.size(); ++i)
                {
                    this->tail_select(context, root, 
                                        path_generator_type::generate(context, last, i, options), current[i], 
                                        receiver, options);
                }
            }
            else if (current.is_object())
            {
                for (auto& member : current.object_range())
                {
                    this->tail_select(context, root, 
                                        path_generator_type::generate(context, last, member.key(), options), 
                                        member.value(), receiver, options);
                }
            }
            //std::cout << "end wildcard_selector\n";
        }